

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

ssize_t __thiscall ScrollPanel::read(ScrollPanel *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint8_t *puVar4;
  int tmp;
  ScrollBarVisibility local_24;
  
  local_24 = (ScrollBarVisibility)((ulong)in_RAX >> 0x20);
  iVar1 = Util::readFloat32((uint8_t *)CONCAT44(in_register_00000034,__fd),&this->panelX);
  puVar4 = (uint8_t *)CONCAT44(in_register_00000034,__fd) + iVar1;
  iVar1 = Util::readFloat32(puVar4,&this->panelY);
  puVar4 = puVar4 + iVar1;
  iVar1 = Util::readFloat32(puVar4,&this->panelWidth);
  puVar4 = puVar4 + iVar1;
  iVar1 = Util::readFloat32(puVar4,&this->panelHeight);
  puVar4 = puVar4 + iVar1;
  iVar1 = Util::readBool(puVar4,&this->horizontalScroll);
  puVar4 = puVar4 + iVar1;
  iVar1 = Util::readBool(puVar4,&this->verticalScroll);
  puVar4 = puVar4 + iVar1;
  iVar1 = Util::readInt32(puVar4,(int *)&local_24);
  this->scrollBarVisibility = local_24;
  iVar2 = Util::readString(puVar4 + iVar1,&this->panelName);
  sVar3 = Widget::read(&this->super_Widget,iVar2 + (int)(puVar4 + iVar1),__buf_00,__nbytes);
  return sVar3;
}

Assistant:

uint8_t* ScrollPanel::read(uint8_t* buf)
{
	buf += Util::readFloat32(buf, panelX);
	buf += Util::readFloat32(buf, panelY);
	buf += Util::readFloat32(buf, panelWidth);
	buf += Util::readFloat32(buf, panelHeight);
	buf += Util::readBool(buf, horizontalScroll);
	buf += Util::readBool(buf, verticalScroll);
	int tmp;
	buf += Util::readInt32(buf, tmp);
	scrollBarVisibility = static_cast<ScrollBarVisibility>(tmp);
	buf += Util::readString(buf, panelName);
	return Widget::read(buf);
}